

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

void gc_mark(global_State *g,GCobj *o)

{
  byte bVar1;
  uint *puVar2;
  GCupval *uv;
  GCobj *pGVar3;
  
LAB_00110824:
  bVar1 = (o->gch).marked & 0xfc;
  (o->gch).marked = bVar1;
  switch((o->gch).gct) {
  case '\x04':
  case '\n':
    goto switchD_0011083f_caseD_4;
  case '\x05':
    puVar2 = (uint *)(ulong)(o->gch).metatable.gcptr32;
    if ((puVar2[1] + 0xd < 9) && (pGVar3 = (GCobj *)(ulong)*puVar2, ((pGVar3->gch).marked & 3) != 0)
       ) {
      gc_mark(g,pGVar3);
    }
    if ((o->gch).unused1 == '\0') {
      return;
    }
    (o->gch).marked = (o->gch).marked | 4;
    return;
  default:
    (o->gch).gclist.gcptr32 = (g->gc).gray.gcptr32;
    (g->gc).gray.gcptr32 = (uint32_t)o;
    goto switchD_0011083f_caseD_4;
  case '\f':
    break;
  }
  pGVar3 = (GCobj *)(ulong)(o->gch).metatable.gcptr32;
  (o->gch).marked = bVar1 | 4;
  if ((pGVar3 != (GCobj *)0x0) && (((pGVar3->gch).marked & 3) != 0)) {
    gc_mark(g,pGVar3);
  }
  o = (GCobj *)(ulong)(o->str).hash;
  if (((o->gch).marked & 3) == 0) {
switchD_0011083f_caseD_4:
    return;
  }
  goto LAB_00110824;
}

Assistant:

static void gc_mark(global_State *g, GCobj *o)
{
  int gct = o->gch.gct;
  lj_assertG(iswhite(o), "mark of non-white object");
  lj_assertG(!isdead(g, o), "mark of dead object");
  white2gray(o);
  if (LJ_UNLIKELY(gct == ~LJ_TUDATA)) {
    GCtab *mt = tabref(gco2ud(o)->metatable);
    gray2black(o);  /* Userdata are never gray. */
    if (mt) gc_markobj(g, mt);
    gc_markobj(g, tabref(gco2ud(o)->env));
  } else if (LJ_UNLIKELY(gct == ~LJ_TUPVAL)) {
    GCupval *uv = gco2uv(o);
    gc_marktv(g, uvval(uv));
    if (uv->closed)
      gray2black(o);  /* Closed upvalues are never gray. */
  } else if (gct != ~LJ_TSTR && gct != ~LJ_TCDATA) {
    lj_assertG(gct == ~LJ_TFUNC || gct == ~LJ_TTAB ||
	       gct == ~LJ_TTHREAD || gct == ~LJ_TPROTO || gct == ~LJ_TTRACE,
	       "bad GC type %d", gct);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}